

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppPluginTest_PluginTest_Test::
CppPluginTest_PluginTest_Test(CppPluginTest_PluginTest_Test *this)

{
  CppPluginTest_PluginTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CppPluginTest_PluginTest_Test_02a036a8;
  return;
}

Assistant:

TEST(CppPluginTest, PluginTest) {
  ABSL_CHECK_OK(
      File::SetContents(absl::StrCat(::testing::TempDir(), "/test.proto"),
                        "syntax = \"proto2\";\n"
                        "package foo;\n"
                        "\n"
                        "enum Thud { VALUE = 0; }\n"
                        "\n"
                        "message Bar {\n"
                        "  message Baz {}\n"
                        "  optional int32 optInt = 1;\n"
                        "  repeated int32 repeatedInt = 2;\n"
                        "\n"
                        "  required string requiredString = 3;\n"
                        "  repeated string repeatedString = 4;\n"
                        "\n"
                        "  optional Baz optMessage = 6;\n"
                        "  repeated Baz repeatedMessage = 7;\n"
                        "\n"
                        "  optional Thud optEnum = 8;\n"
                        "  repeated Thud repeatedEnum = 9;\n"
                        "\n"
                        "  required string requiredCord = 10 [\n"
                        "    ctype = CORD\n"
                        "  ];\n"
                        "  repeated string repeatedCord = 11 [\n"
                        "    ctype = CORD\n"
                        "  ];\n"
                        "\n"
                        "  oneof Moo {\n"
                        "    int64 oneOfInt = 20;\n"
                        "    string oneOfString = 21;\n"
                        "    Baz oneOfMessage = 22;\n"
                        "    Thud oneOfEnum = 23;"
                        "    string oneOfCord = 24 [\n"
                        "      ctype = CORD\n"
                        "    ];\n"
                        "  }\n"
                        "}\n",
                        true));

  CommandLineInterface cli;
  cli.SetInputsAreProtoPathRelative(true);

  CppGenerator cpp_generator;
  TestGenerator test_generator;
  cli.RegisterGenerator("--cpp_out", &cpp_generator, "");
  cli.RegisterGenerator("--test_out", &test_generator, "");

  std::string proto_path = absl::StrCat("-I", ::testing::TempDir());
  std::string cpp_out = absl::StrCat("--cpp_out=", ::testing::TempDir());
  std::string test_out = absl::StrCat("--test_out=", ::testing::TempDir());

  const char* argv[] = {"protoc", proto_path.c_str(), cpp_out.c_str(),
                        test_out.c_str(), "test.proto"};

  EXPECT_EQ(0, cli.Run(5, argv));
}